

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NearestNeighbors.pb.h
# Opt level: O0

InverseDistanceWeighting * __thiscall
CoreML::Specification::KNearestNeighborsClassifier::mutable_inversedistanceweighting
          (KNearestNeighborsClassifier *this)

{
  bool bVar1;
  InverseDistanceWeighting *this_00;
  KNearestNeighborsClassifier *this_local;
  
  bVar1 = has_inversedistanceweighting(this);
  if (!bVar1) {
    clear_WeightingScheme(this);
    set_has_inversedistanceweighting(this);
    this_00 = (InverseDistanceWeighting *)operator_new(0x18);
    InverseDistanceWeighting::InverseDistanceWeighting(this_00);
    (this->WeightingScheme_).inversedistanceweighting_ = this_00;
  }
  return (InverseDistanceWeighting *)(this->WeightingScheme_).uniformweighting_;
}

Assistant:

inline ::CoreML::Specification::InverseDistanceWeighting* KNearestNeighborsClassifier::mutable_inversedistanceweighting() {
  if (!has_inversedistanceweighting()) {
    clear_WeightingScheme();
    set_has_inversedistanceweighting();
    WeightingScheme_.inversedistanceweighting_ = new ::CoreML::Specification::InverseDistanceWeighting;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.KNearestNeighborsClassifier.inverseDistanceWeighting)
  return WeightingScheme_.inversedistanceweighting_;
}